

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          StringPtr *params_2,char (*params_3) [3],String *params_4)

{
  char *pcVar1;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  undefined8 local_48;
  long local_40;
  ArrayPtr<const_char> local_38;
  
  local_48 = *(undefined8 *)this;
  local_40 = *(long *)(this + 8) + -1;
  local_58.size_ = strlen((char *)params);
  local_68.ptr = *(char **)params_1;
  local_68.size_ = *(long *)(params_1 + 4) - 1;
  local_58.ptr = (char *)params;
  strlen((char *)params_2);
  pcVar1 = *(char **)(params_3[2] + 2);
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = *(char **)params_3;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff88,&local_38,&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}